

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

bool __thiscall
bidirectional::BiDirectional::checkValidLabel
          (BiDirectional *this,Directions *direction,Label *label)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  Label *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  Label *this_00;
  
  if ((in_RDX->vertex).lemon_id != -1) {
    this_00 = in_RDX;
    std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
    operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_> *)
               0x2467c4);
    std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
    operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_> *)
               0x2467df);
    bVar1 = labelling::Label::checkStPath
                      (this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) {
      pPVar3 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
               operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                           *)0x24680d);
      uVar2 = std::isnan(pPVar3->threshold);
      if ((uVar2 & 1) == 0) {
        pPVar3 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                 ::operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                               *)0x246833);
        bVar1 = labelling::Label::checkThreshold(in_RDX,&pPVar3->threshold);
        if (bVar1) {
          *(undefined1 *)(in_RDI + 0x5c) = 1;
          *(undefined4 *)(in_RDI + 0x60) = *in_RSI;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool BiDirectional::checkValidLabel(
    const Directions&       direction,
    const labelling::Label& label) {
  if (label.vertex.lemon_id != -1 &&
      label.checkStPath(graph_ptr_->source.user_id, graph_ptr_->sink.user_id)) {
    if (!std::isnan(params_ptr_->threshold) &&
        label.checkThreshold(params_ptr_->threshold)) {
      terminated_early_w_st_path_           = true;
      terminated_early_w_st_path_direction_ = direction;
      return true;
    }
  }
  return false;
}